

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

void LowererMD::GenerateDebugBreak(Instr *insertInstr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  Instr *instr;
  IntConstOpnd *this;
  undefined4 *puVar4;
  
  instr = IR::Instr::New(INT,insertInstr->m_func);
  this = IR::IntConstOpnd::New(3,TyInt32,insertInstr->m_func,false);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_0065755e;
    *puVar4 = 0;
  }
  func = instr->m_func;
  if ((this->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_0065755e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = (this->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    this = (IntConstOpnd *)IR::Opnd::Copy(&this->super_Opnd,func);
    bVar3 = (this->super_Opnd).field_0xb;
  }
  (this->super_Opnd).field_0xb = bVar3 | 2;
  instr->m_src1 = &this->super_Opnd;
  IR::Instr::InsertBefore(insertInstr,instr);
  return;
}

Assistant:

void LowererMD::GenerateDebugBreak( IR::Instr * insertInstr )
{
    // int 3

    IR::Instr *int3 = IR::Instr::New(Js::OpCode::INT, insertInstr->m_func);
    int3->SetSrc1(IR::IntConstOpnd::New(3, TyInt32, insertInstr->m_func));
    insertInstr->InsertBefore(int3);
}